

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

QList<QTableWidgetItem_*> * __thiscall
QTableModel::columnItems
          (QList<QTableWidgetItem_*> *__return_storage_ptr__,QTableModel *this,int column)

{
  long lVar1;
  int iVar2;
  QTableWidgetItem *t;
  int row;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QTableWidgetItem **)0x0;
  iVar2 = (**(code **)(*(long *)this + 0x78))(this);
  QList<QTableWidgetItem_*>::reserve(__return_storage_ptr__,(long)iVar2);
  row = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
    row = 0;
  }
  for (; iVar2 != row; row = row + 1) {
    t = item(this,row,column);
    if (t == (QTableWidgetItem *)0x0) break;
    QList<QTableWidgetItem_*>::append(__return_storage_ptr__,t);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QTableWidgetItem *> QTableModel::columnItems(int column) const
{
    QList<QTableWidgetItem *> items;
    int rc = rowCount();
    items.reserve(rc);
    for (int row = 0; row < rc; ++row) {
        QTableWidgetItem *itm = item(row, column);
        if (itm == nullptr) {
            // no more sortable items (all 0-items are
            // at the end of the table when it is sorted)
            break;
        }
        items.append(itm);
    }
    return items;
}